

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

void __thiscall
QWidgetTextControlPrivate::selectionChanged
          (QWidgetTextControlPrivate *this,bool forceEmitSelectionChanged)

{
  QObject *pQVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  undefined1 local_69;
  code *local_68;
  undefined1 *local_60;
  long local_58;
  undefined4 local_50;
  undefined4 local_4c;
  int local_48;
  undefined4 local_44;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  if ((int)CONCAT71(in_register_00000031,forceEmitSelectionChanged) != 0) {
    QMetaObject::activate(pQVar1,&QWidgetTextControl::staticMetaObject,5,(void **)0x0);
    lVar2 = *(long *)(*(long *)(pQVar1 + 8) + 0x10);
    if ((lVar2 != 0) && ((*(byte *)(*(long *)(lVar2 + 8) + 0x30) & 1) != 0)) {
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      iVar4 = QTextCursor::anchor();
      local_44 = QTextCursor::position();
      local_4c = 0;
      if (iVar4 != -1) {
        local_4c = local_44;
      }
      local_50 = 0xffffffff;
      local_68 = QPixmap::load;
      local_60 = (undefined1 *)CONCAT44(local_60._4_4_,0x121);
      local_58 = lVar2;
      local_48 = iVar4;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_68);
      QAccessibleTextSelectionEvent::~QAccessibleTextSelectionEvent
                ((QAccessibleTextSelectionEvent *)&local_68);
    }
  }
  iVar4 = QTextCursor::position();
  if ((iVar4 == this->lastSelectionPosition) &&
     (iVar4 = QTextCursor::anchor(), iVar4 == this->lastSelectionAnchor)) goto LAB_004bd004;
  cVar3 = QTextCursor::hasSelection();
  if ((bool)cVar3 == (this->lastSelectionPosition == this->lastSelectionAnchor)) {
    local_69 = QTextCursor::hasSelection();
    local_60 = &local_69;
    local_68 = (code *)0x0;
    QMetaObject::activate(pQVar1,&QWidgetTextControl::staticMetaObject,4,&local_68);
    if (!forceEmitSelectionChanged) goto LAB_004bcf32;
  }
  else if (((!forceEmitSelectionChanged) && (cVar3 = QTextCursor::hasSelection(), cVar3 != '\0')) &&
          ((iVar4 = QTextCursor::position(), iVar4 != this->lastSelectionPosition ||
           (iVar4 = QTextCursor::anchor(), iVar4 != this->lastSelectionAnchor)))) {
LAB_004bcf32:
    QMetaObject::activate(pQVar1,&QWidgetTextControl::staticMetaObject,5,(void **)0x0);
    lVar2 = *(long *)(*(long *)(pQVar1 + 8) + 0x10);
    if ((lVar2 != 0) && ((*(byte *)(*(long *)(lVar2 + 8) + 0x30) & 1) != 0)) {
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      iVar4 = QTextCursor::anchor();
      local_44 = QTextCursor::position();
      local_4c = 0;
      if (iVar4 != -1) {
        local_4c = local_44;
      }
      local_50 = 0xffffffff;
      local_68 = QPixmap::load;
      local_60 = (undefined1 *)CONCAT44(local_60._4_4_,0x121);
      local_58 = lVar2;
      local_48 = iVar4;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_68);
      QAccessibleTextSelectionEvent::~QAccessibleTextSelectionEvent
                ((QAccessibleTextSelectionEvent *)&local_68);
    }
  }
  QMetaObject::activate(pQVar1,&QWidgetTextControl::staticMetaObject,0xc,(void **)0x0);
  iVar4 = QTextCursor::position();
  this->lastSelectionPosition = iVar4;
  iVar4 = QTextCursor::anchor();
  this->lastSelectionAnchor = iVar4;
LAB_004bd004:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::selectionChanged(bool forceEmitSelectionChanged /*=false*/)
{
    Q_Q(QWidgetTextControl);
    if (forceEmitSelectionChanged) {
        emit q->selectionChanged();
#if QT_CONFIG(accessibility)
        if (q->parent() && q->parent()->isWidgetType()) {
            QAccessibleTextSelectionEvent ev(q->parent(), cursor.anchor(), cursor.position());
            QAccessible::updateAccessibility(&ev);
        }
#endif
    }

    if (cursor.position() == lastSelectionPosition
        && cursor.anchor() == lastSelectionAnchor)
        return;

    bool selectionStateChange = (cursor.hasSelection()
                                 != (lastSelectionPosition != lastSelectionAnchor));
    if (selectionStateChange)
        emit q->copyAvailable(cursor.hasSelection());

    if (!forceEmitSelectionChanged
        && (selectionStateChange
            || (cursor.hasSelection()
                && (cursor.position() != lastSelectionPosition
                    || cursor.anchor() != lastSelectionAnchor)))) {
        emit q->selectionChanged();
#if QT_CONFIG(accessibility)
        if (q->parent() && q->parent()->isWidgetType()) {
            QAccessibleTextSelectionEvent ev(q->parent(), cursor.anchor(), cursor.position());
            QAccessible::updateAccessibility(&ev);
        }
#endif
    }
    emit q->microFocusChanged();
    lastSelectionPosition = cursor.position();
    lastSelectionAnchor = cursor.anchor();
}